

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.c
# Opt level: O3

void dumpsymboltable(void)

{
  int iVar1;
  ulong uVar2;
  
  puts("SYMBOL TABLE DUMP\n-----------------\n");
  printf("                   Token       Symbol     Data");
  puts("              Owning");
  printf("Index   Name       Class       Type       Type");
  puts("    Value   Procedure    Label");
  printf("-----   ----       -----       ------     ----");
  puts("    -----   ---------");
  if (0 < symtablen) {
    uVar2 = 0;
    do {
      printf("%5d\t",uVar2 & 0xffffffff);
      printlexeme((int)uVar2);
      if (nametable[symtab[uVar2].thisname].strlength < 0xb) {
        iVar1 = 0;
        do {
          putchar(0x20);
          iVar1 = iVar1 + 1;
        } while (iVar1 < 0xb - nametable[symtab[uVar2].thisname].strlength);
      }
      else {
        printf("\n          ");
      }
      printf("%s  ",tokclstring[symtab[uVar2].tok_class]);
      printf("%s  ",symtypestring[symtab[uVar2].symtype]);
      printf("%s",datatypestring[symtab[uVar2].dataclass]);
      if (symtab[uVar2].value.tag == tint) {
        printf(" %5d",(ulong)(uint)symtab[uVar2].value.val.ival);
      }
      else {
        printf(" %8.3f",(double)symtab[uVar2].value.val.rval);
      }
      if (symtab[uVar2].owningprocedure == -1) {
        printf("   global");
      }
      else {
        printf("   ");
        LexemeInCaps(symtab[uVar2].owningprocedure);
      }
      printf("   %s",uVar2 * 0x30 + 0x118424);
      putchar(10);
      uVar2 = uVar2 + 1;
    } while ((long)uVar2 < (long)symtablen);
  }
  return;
}

Assistant:

void dumpsymboltable(void)
{
    int  i, j;
    
    printf("SYMBOL TABLE DUMP\n-----------------\n\n");
    printf("                   Token       Symbol     Data");
    printf("              Owning\n");
    printf("Index   Name       Class       Type       Type");
    printf("    Value   Procedure    Label\n");
    printf("-----   ----       -----       ------     ----");
    printf("    -----   ---------\n");
    
    for  (i = 0;  i < symtablen;  i++) {
        printf("%5d\t",i);
        printlexeme(i);
        if (nametable[symtab[i].thisname].strlength < 11)
            for (j = 0;
                 j < 11
                 - nametable[symtab[i].thisname].strlength;
                 j++)
                putchar(' ');
        else
            printf("\n          ");
        
        printf("%s  ",tokclstring[symtab[i].tok_class]);
        
        printf("%s  ", symtypestring[symtab[i].symtype]);
        
        printf("%s",  datatypestring[symtab[i].dataclass]);
        
        if (symtab[i].value.tag == tint)
            printf(" %5d", symtab[i].value.val.ival);
        else
            printf(" %8.3f", symtab[i].value.val.rval);
        
        if (symtab[i].owningprocedure == -1)
            printf("   global");
        else {
            printf("   ");
            LexemeInCaps(symtab[i].owningprocedure);
        }
        printf("   %s", symtab[i].label);
        putchar('\n');
    }
    
}